

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadField(BinaryReader *this,TypeMut *out_value)

{
  Enum EVar1;
  Type type;
  bool bVar2;
  Result RVar3;
  char *pcVar4;
  Enum EVar5;
  uint8_t mutable_;
  Type field_type;
  bool local_29;
  Type local_28;
  
  RVar3 = ReadType(this,&local_28,"field type");
  EVar5 = Error;
  if (RVar3.enum_ != Error) {
    type.type_index_ = local_28.type_index_;
    type.enum_ = local_28.enum_;
    bVar2 = IsConcreteType(this,type);
    if (bVar2) {
      local_29 = false;
      RVar3 = ReadU8(this,&local_29,"field mutability");
      EVar5 = Error;
      if (RVar3.enum_ != Error) {
        if (local_29 < true) {
          out_value->type = type;
          out_value->mutable_ = local_29;
          EVar5 = Ok;
        }
        else {
          PrintError(this,"field mutability must be 0 or 1");
        }
      }
    }
    else {
      pcVar4 = "";
      if (local_28.enum_ < Any) {
        pcVar4 = "-";
      }
      EVar1 = -local_28.enum_;
      if (Any < local_28.enum_) {
        EVar1 = local_28.enum_;
      }
      PrintError(this,"expected valid field type (got %s%#x)",pcVar4,(ulong)(uint)EVar1);
    }
  }
  return (Result)EVar5;
}

Assistant:

Result BinaryReader::ReadField(TypeMut* out_value) {
  // TODO: Reuse for global header too?
  Type field_type;
  CHECK_RESULT(ReadType(&field_type, "field type"));
  ERROR_UNLESS(IsConcreteType(field_type),
               "expected valid field type (got " PRItypecode ")",
               WABT_PRINTF_TYPE_CODE(field_type));

  uint8_t mutable_ = 0;
  CHECK_RESULT(ReadU8(&mutable_, "field mutability"));
  ERROR_UNLESS(mutable_ <= 1, "field mutability must be 0 or 1");
  out_value->type = field_type;
  out_value->mutable_ = mutable_;
  return Result::Ok;
}